

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_table_filter.cpp
# Opt level: O2

void __thiscall duckdb::ConstantFilter::Serialize(ConstantFilter *this,Serializer *serializer)

{
  TableFilter::Serialize(&this->super_TableFilter,serializer);
  Serializer::WriteProperty<duckdb::ExpressionType>
            (serializer,200,"comparison_type",&(this->super_TableFilter).field_0x9);
  Serializer::WriteProperty<duckdb::Value>(serializer,0xc9,"constant",&this->constant);
  return;
}

Assistant:

void ConstantFilter::Serialize(Serializer &serializer) const {
	TableFilter::Serialize(serializer);
	serializer.WriteProperty<ExpressionType>(200, "comparison_type", comparison_type);
	serializer.WriteProperty<Value>(201, "constant", constant);
}